

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opn_chip_family.h
# Opt level: O2

uint32_t __thiscall
OPNChipBaseT<NP2OPNA<FM::OPNB>_>::nativeClockRate(OPNChipBaseT<NP2OPNA<FM::OPNB>_> *this)

{
  uint32_t uVar1;
  
  uVar1 = 0x750ab6;
  if ((this->super_OPNChipBase).m_family == OPNChip_OPNA) {
    uVar1 = 0x79e000;
  }
  return uVar1;
}

Assistant:

inline uint32_t opn2_getNativeClockRate(OPNFamily f)
{
    switch(f)
    {
    default:
    #define Each(x) case OPNChip_##x: \
        return OPNFamilyTraits<OPNChip_##x>::nativeClockRate;
    OPN_FAMILY_EACH(Each)
    #undef Each
    }
}